

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codeholder.cpp
# Opt level: O1

void asmjit::v1_14::CodeHolder_resetInternal(CodeHolder *self,ResetPolicy resetPolicy)

{
  uint uVar1;
  long lVar2;
  undefined4 in_register_00000034;
  BaseEmitter *emitter;
  CodeHolder *this;
  ulong uVar3;
  
  emitter = (BaseEmitter *)CONCAT44(in_register_00000034,resetPolicy);
  uVar3 = (ulong)*(uint *)&self->field_0xd0;
  this = self;
  while (uVar3 != 0) {
    uVar3 = uVar3 - 1;
    if (*(uint *)&self->field_0xd0 <= uVar3) {
      CodeHolder_resetInternal();
      goto LAB_0011856a;
    }
    emitter = *(BaseEmitter **)(*(long *)&self->_emitters + uVar3 * 8);
    this = self;
    CodeHolder::detach(self,emitter);
  }
  *(undefined8 *)&self->field_0x10 = 0;
  *(undefined8 *)&self->field_0x18 = 0;
  (self->_environment)._arch = kUnknown;
  (self->_environment)._subArch = kHost;
  (self->_environment)._vendor = kHost;
  (self->_environment)._platform = kUnknown;
  (self->_environment)._platformABI = kUnknown;
  (self->_environment)._objectFormat = kUnknown;
  (self->_environment)._floatABI = kHardFloat;
  (self->_environment)._reserved = '\0';
  *(undefined8 *)&self->_cpuFeatures = 0;
  *(undefined8 *)&self->field_0x20 = 0;
  self->_baseAddress = 0xffffffffffffffff;
  self->_logger = (Logger *)0x0;
  self->_errorHandler = (ErrorHandler *)0x0;
  uVar1 = *(uint *)&self->field_0xe0;
  if ((ulong)uVar1 != 0) {
    uVar3 = 0;
    do {
      if (*(uint *)&self->field_0xe0 <= uVar3) {
LAB_0011856a:
        CodeHolder_resetInternal();
        CodeHolder::init(this,(EVP_PKEY_CTX *)emitter);
        return;
      }
      lVar2 = *(long *)(*(long *)&self->_sections + uVar3 * 8);
      this = *(CodeHolder **)(lVar2 + 0x48);
      if ((this != (CodeHolder *)0x0) && ((*(byte *)(lVar2 + 0x60) & 1) == 0)) {
        free(this);
      }
      *(undefined8 *)(lVar2 + 0x48) = 0;
      *(undefined8 *)(lVar2 + 0x58) = 0;
      uVar3 = uVar3 + 1;
    } while (uVar1 != uVar3);
  }
  *(undefined8 *)&self->_emitters = 0;
  *(undefined8 *)&self->field_0xd0 = 0;
  *(undefined1 **)&self->_namedLabels = &self->field_0x138;
  *(undefined8 *)&self->field_0x120 = 0;
  *(undefined8 *)&self->field_0x128 = 0x100000001;
  *(undefined4 *)&self->field_0x130 = 1;
  *(undefined2 *)&self->field_0x134 = 0;
  *(undefined8 *)&self->_relocations = 0;
  *(undefined8 *)&self->field_0x110 = 0;
  *(undefined8 *)&self->_labelEntries = 0;
  *(undefined8 *)&self->field_0x100 = 0;
  *(undefined8 *)&self->_sectionsByOrder = 0;
  *(undefined8 *)&self->field_0xf0 = 0;
  *(undefined8 *)&self->_sections = 0;
  *(undefined8 *)&self->field_0xe0 = 0;
  self->_addressTableSection = (Section *)0x0;
  *(undefined8 *)&self->_addressTableEntries = 0;
  *(undefined8 *)&self->field_0x138 = 0;
  self->_unresolvedLinkCount = 0;
  ZoneAllocator::reset(&self->_allocator,&self->_zone);
  Zone::reset(&self->_zone,resetPolicy);
  return;
}

Assistant:

static void CodeHolder_resetInternal(CodeHolder* self, ResetPolicy resetPolicy) noexcept {
  uint32_t i;
  const ZoneVector<BaseEmitter*>& emitters = self->emitters();

  i = emitters.size();
  while (i)
    self->detach(emitters[--i]);

  // Reset everything into its construction state.
  self->_environment.reset();
  self->_cpuFeatures.reset();
  self->_baseAddress = Globals::kNoBaseAddress;
  self->_logger = nullptr;
  self->_errorHandler = nullptr;

  // Reset all sections.
  uint32_t numSections = self->_sections.size();
  for (i = 0; i < numSections; i++) {
    Section* section = self->_sections[i];
    if (section->_buffer.data() && !section->_buffer.isExternal())
      ::free(section->_buffer._data);
    section->_buffer._data = nullptr;
    section->_buffer._capacity = 0;
  }

  // Reset zone allocator and all containers using it.
  ZoneAllocator* allocator = self->allocator();

  self->_emitters.reset();
  self->_namedLabels.reset();
  self->_relocations.reset();
  self->_labelEntries.reset();
  self->_sections.reset();
  self->_sectionsByOrder.reset();

  self->_unresolvedLinkCount = 0;
  self->_addressTableSection = nullptr;
  self->_addressTableEntries.reset();

  allocator->reset(&self->_zone);
  self->_zone.reset(resetPolicy);
}